

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O3

int Ssc_PerformVerification(Gia_Man_t *p0,Gia_Man_t *p1,Gia_Man_t *pC)

{
  int iVar1;
  Gia_Man_t *p1_00;
  Gia_Man_t *p0_00;
  Gia_Man_t *p1_01;
  Gia_Man_t *pInit;
  Cec_ParCec_t ParsCec;
  Cec_ParCec_t local_4c;
  
  p1_00 = Gia_ManDupAndOr(pC,p0->vCos->nSize - p0->nRegs,1,0);
  p0_00 = Gia_ManMiter(p0,p1_00,0,0,0,1,0);
  p1_01 = Gia_ManMiter(p1,p1_00,0,0,0,1,0);
  pInit = Gia_ManMiter(p0_00,p1_01,0,1,0,0,0);
  Gia_ManStop(p0_00);
  Gia_ManStop(p1_01);
  Gia_ManStop(p1_00);
  Cec_ManCecSetDefaultParams(&local_4c);
  iVar1 = Cec_ManVerify(pInit,&local_4c);
  Gia_ManStop(pInit);
  if (iVar1 + 1U < 3) {
    puts(&DAT_0095eab8 + *(int *)(&DAT_0095eab8 + (ulong)(iVar1 + 1U) * 4));
    return iVar1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                ,0xf9,"int Ssc_PerformVerification(Gia_Man_t *, Gia_Man_t *, Gia_Man_t *)");
}

Assistant:

int Ssc_PerformVerification( Gia_Man_t * p0, Gia_Man_t * p1, Gia_Man_t * pC )
{
    int Status;
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    // derive the OR of constraint outputs
    Gia_Man_t * pCond = Gia_ManDupAndOr( pC, Gia_ManPoNum(p0), 1, 0 );
    // derive F = F & !OR(c0, c1, c2, ...)
    Gia_Man_t * p0c = Gia_ManMiter( p0, pCond, 0, 0, 0, 1, 0 );
    // derive F = F & !OR(c0, c1, c2, ...)
    Gia_Man_t * p1c = Gia_ManMiter( p1, pCond, 0, 0, 0, 1, 0 );
    // derive dual-output miter
    Gia_Man_t * pMiter = Gia_ManMiter( p0c, p1c, 0, 1, 0, 0, 0 );
    Gia_ManStop( p0c );
    Gia_ManStop( p1c );
    Gia_ManStop( pCond );
    // run equivalence checking
    Cec_ManCecSetDefaultParams( pPars );
    Status = Cec_ManVerify( pMiter, pPars );
    Gia_ManStop( pMiter );
    // report the results
    if ( Status == 1 )
        printf( "Verification succeeded.\n" );
    else if ( Status == 0 )
        printf( "Verification failed.\n" );
    else if ( Status == -1 )
        printf( "Verification undecided.\n" );
    else assert( 0 );
    return Status;
}